

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Dropout_x86_avx::forward_inplace(Dropout_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [16];
  int iVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  Mat local_78;
  
  if (*(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86_avx[-3]) != 1.0) {
    iVar6 = bottom_top_blob->dims;
    auVar18 = ZEXT416((uint)*(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86_avx[-3]));
    if (bottom_top_blob->elempack == 4) {
      uVar7 = bottom_top_blob->w;
      uVar14 = bottom_top_blob->h;
      auVar18 = vshufps_avx(auVar18,auVar18,0);
      fVar23 = auVar18._0_4_;
      fVar24 = auVar18._4_4_;
      fVar25 = auVar18._8_4_;
      fVar26 = auVar18._12_4_;
      if (iVar6 == 3) {
        iVar15 = uVar14 * uVar7;
        iVar6 = bottom_top_blob->c;
        iVar13 = 0;
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        for (; iVar13 != iVar6; iVar13 = iVar13 + 1) {
          Mat::channel(&local_78,bottom_top_blob,iVar13);
          pauVar11 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          iVar8 = iVar15;
          while (bVar16 = iVar8 != 0, iVar8 = iVar8 + -1, bVar16) {
            auVar18._0_4_ = fVar23 * *(float *)*pauVar11;
            auVar18._4_4_ = fVar24 * *(float *)(*pauVar11 + 4);
            auVar18._8_4_ = fVar25 * *(float *)(*pauVar11 + 8);
            auVar18._12_4_ = fVar26 * *(float *)(*pauVar11 + 0xc);
            *(undefined1 (*) [16])*pauVar11 = auVar18;
            pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          }
        }
      }
      else if (iVar6 == 2) {
        uVar10 = 0;
        if ((int)uVar7 < 1) {
          uVar7 = 0;
        }
        uVar9 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar9 = 0;
        }
        for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
          pauVar12 = (undefined1 (*) [16])
                     ((long)bottom_top_blob->w * uVar10 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar14 = uVar7;
          while (bVar16 = uVar14 != 0, uVar14 = uVar14 - 1, bVar16) {
            auVar17._0_4_ = fVar23 * *(float *)*pauVar12;
            auVar17._4_4_ = fVar24 * *(float *)((long)*pauVar12 + 4);
            auVar17._8_4_ = fVar25 * *(float *)((long)*pauVar12 + 8);
            auVar17._12_4_ = fVar26 * *(float *)((long)*pauVar12 + 0xc);
            *pauVar12 = auVar17;
            pauVar12 = pauVar12 + 1;
          }
        }
      }
      else if (iVar6 == 1) {
        uVar9 = 0;
        uVar10 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar10 = uVar9;
        }
        for (; uVar10 * 0x10 != uVar9; uVar9 = uVar9 + 0x10) {
          pfVar1 = (float *)((long)bottom_top_blob->data + uVar9);
          fVar3 = pfVar1[1];
          fVar4 = pfVar1[2];
          fVar5 = pfVar1[3];
          pfVar2 = (float *)((long)bottom_top_blob->data + uVar9);
          *pfVar2 = fVar23 * *pfVar1;
          pfVar2[1] = fVar24 * fVar3;
          pfVar2[2] = fVar25 * fVar4;
          pfVar2[3] = fVar26 * fVar5;
        }
      }
    }
    else {
      if (bottom_top_blob->elempack != 8) {
        iVar6 = Dropout::forward_inplace
                          ((Dropout *)
                           ((long)&this->_vptr_Dropout_x86_avx +
                           (long)this->_vptr_Dropout_x86_avx[-3]),bottom_top_blob,opt);
        return iVar6;
      }
      uVar7 = bottom_top_blob->w;
      uVar14 = bottom_top_blob->h;
      auVar18 = vshufps_avx(auVar18,auVar18,0);
      auVar19 = ZEXT1664(auVar18);
      fVar23 = auVar18._0_4_;
      fVar24 = auVar18._4_4_;
      fVar25 = auVar18._8_4_;
      fVar26 = auVar18._12_4_;
      if (iVar6 == 3) {
        iVar15 = uVar14 * uVar7;
        iVar6 = bottom_top_blob->c;
        iVar13 = 0;
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        for (; iVar13 != iVar6; iVar13 = iVar13 + 1) {
          auVar19 = ZEXT1664(auVar19._0_16_);
          Mat::channel(&local_78,bottom_top_blob,iVar13);
          pauVar11 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          iVar8 = iVar15;
          while (bVar16 = iVar8 != 0, iVar8 = iVar8 + -1, bVar16) {
            auVar22._0_4_ = fVar23 * *(float *)*pauVar11;
            auVar22._4_4_ = fVar24 * *(float *)(*pauVar11 + 4);
            auVar22._8_4_ = fVar25 * *(float *)(*pauVar11 + 8);
            auVar22._12_4_ = fVar26 * *(float *)(*pauVar11 + 0xc);
            auVar22._16_4_ = fVar23 * *(float *)(*pauVar11 + 0x10);
            auVar22._20_4_ = fVar24 * *(float *)(*pauVar11 + 0x14);
            auVar22._28_36_ = auVar19._28_36_;
            auVar22._24_4_ = fVar25 * *(float *)(*pauVar11 + 0x18);
            auVar19 = ZEXT3264(auVar22._0_32_);
            *pauVar11 = auVar22._0_32_;
            pauVar11 = pauVar11 + 1;
          }
        }
      }
      else if (iVar6 == 2) {
        uVar10 = 0;
        if ((int)uVar7 < 1) {
          uVar7 = 0;
        }
        uVar9 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar9 = 0;
        }
        for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
          pauVar11 = (undefined1 (*) [32])
                     ((long)bottom_top_blob->w * uVar10 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar14 = uVar7;
          while (bVar16 = uVar14 != 0, uVar14 = uVar14 - 1, bVar16) {
            auVar21._0_4_ = fVar23 * *(float *)*pauVar11;
            auVar21._4_4_ = fVar24 * *(float *)((long)*pauVar11 + 4);
            auVar21._8_4_ = fVar25 * *(float *)((long)*pauVar11 + 8);
            auVar21._12_4_ = fVar26 * *(float *)((long)*pauVar11 + 0xc);
            auVar21._16_4_ = fVar23 * *(float *)((long)*pauVar11 + 0x10);
            auVar21._20_4_ = fVar24 * *(float *)((long)*pauVar11 + 0x14);
            auVar21._28_36_ = auVar19._28_36_;
            auVar21._24_4_ = fVar25 * *(float *)((long)*pauVar11 + 0x18);
            auVar19 = ZEXT3264(auVar21._0_32_);
            *pauVar11 = auVar21._0_32_;
            pauVar11 = pauVar11 + 1;
          }
        }
      }
      else if (iVar6 == 1) {
        uVar9 = 0;
        uVar10 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar10 = uVar9;
        }
        for (; uVar10 * 0x20 != uVar9; uVar9 = uVar9 + 0x20) {
          pfVar1 = (float *)((long)bottom_top_blob->data + uVar9);
          auVar20._0_4_ = fVar23 * *pfVar1;
          auVar20._4_4_ = fVar24 * pfVar1[1];
          auVar20._8_4_ = fVar25 * pfVar1[2];
          auVar20._12_4_ = fVar26 * pfVar1[3];
          auVar20._16_4_ = fVar23 * pfVar1[4];
          auVar20._20_4_ = fVar24 * pfVar1[5];
          auVar20._28_36_ = auVar19._28_36_;
          auVar20._24_4_ = fVar25 * pfVar1[6];
          auVar19 = ZEXT3264(auVar20._0_32_);
          *(undefined1 (*) [32])((long)bottom_top_blob->data + uVar9) = auVar20._0_32_;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}